

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLpRelaxation.cpp
# Opt level: O2

void __thiscall
HighsLpRelaxation::removeCuts
          (HighsLpRelaxation *this,HighsInt ndelcuts,vector<int,_std::allocator<int>_> *deletemask)

{
  Highs *this_00;
  int iVar1;
  pointer pLVar2;
  undefined8 uVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  allocator local_b1;
  string local_b0;
  HighsBasis basis;
  
  if (0 < ndelcuts) {
    this_00 = &this->lpsolver;
    HighsBasis::HighsBasis(&basis,&(this->lpsolver).basis_);
    iVar1 = (this->lpsolver).model_.lp_.num_row_;
    Highs::deleteRows(this_00,(deletemask->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                              super__Vector_impl_data._M_start);
    lVar4 = (long)this->mipsolver->model_->num_row_;
    lVar5 = lVar4 * 0xc;
    for (; iVar1 != lVar4; lVar4 = lVar4 + 1) {
      lVar6 = (long)(deletemask->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_start[lVar4];
      if (-1 < lVar6) {
        pLVar2 = (this->lprows).
                 super__Vector_base<HighsLpRelaxation::LpRow,_std::allocator<HighsLpRelaxation::LpRow>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pLVar2[lVar6].age = *(HighsInt *)((long)&pLVar2->age + lVar5);
        uVar3 = *(undefined8 *)((long)&pLVar2->origin + lVar5);
        pLVar2[lVar6].origin = (int)uVar3;
        pLVar2[lVar6].index = (int)((ulong)uVar3 >> 0x20);
        basis.row_status.super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>.
        _M_impl.super__Vector_impl_data._M_start
        [(deletemask->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
         ._M_start[lVar4]] =
             basis.row_status.
             super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
             super__Vector_impl_data._M_start[lVar4];
      }
      lVar5 = lVar5 + 0xc;
    }
    std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::resize
              (&basis.row_status,
               (long)basis.row_status.
                     super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl
                     .super__Vector_impl_data._M_finish -
               (long)(basis.row_status.
                      super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>.
                      _M_impl.super__Vector_impl_data._M_start + (uint)ndelcuts));
    std::vector<HighsLpRelaxation::LpRow,_std::allocator<HighsLpRelaxation::LpRow>_>::resize
              (&this->lprows,
               ((long)(this->lprows).
                      super__Vector_base<HighsLpRelaxation::LpRow,_std::allocator<HighsLpRelaxation::LpRow>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this->lprows).
                     super__Vector_base<HighsLpRelaxation::LpRow,_std::allocator<HighsLpRelaxation::LpRow>_>
                     ._M_impl.super__Vector_impl_data._M_start) / 0xc - (ulong)(uint)ndelcuts);
    std::__cxx11::string::assign((char *)&basis.debug_origin_name);
    std::__cxx11::string::string((string *)&local_b0,"",&local_b1);
    Highs::setBasis(this_00,&basis,&local_b0);
    std::__cxx11::string::~string((string *)&local_b0);
    HighsMipAnalysis::mipTimerStart(&this->mipsolver->analysis_,0x39);
    Highs::run(this_00);
    HighsMipAnalysis::mipTimerStop(&this->mipsolver->analysis_,0x39);
    HighsBasis::~HighsBasis(&basis);
  }
  return;
}

Assistant:

void HighsLpRelaxation::removeCuts(HighsInt ndelcuts,
                                   std::vector<HighsInt>& deletemask) {
  assert(lpsolver.getLp().num_row_ ==
         (HighsInt)lpsolver.getLp().row_lower_.size());
  if (ndelcuts > 0) {
    HighsBasis basis = lpsolver.getBasis();
    HighsInt nlprows = lpsolver.getNumRow();
    lpsolver.deleteRows(deletemask.data());
    for (HighsInt i = mipsolver.numRow(); i != nlprows; ++i) {
      if (deletemask[i] >= 0) {
        lprows[deletemask[i]] = lprows[i];
        basis.row_status[deletemask[i]] = basis.row_status[i];
      }
    }

    assert(lpsolver.getLp().num_row_ ==
           (HighsInt)lpsolver.getLp().row_lower_.size());

    basis.row_status.resize(basis.row_status.size() - ndelcuts);
    lprows.resize(lprows.size() - ndelcuts);

    assert(lpsolver.getLp().num_row_ == (HighsInt)lprows.size());
    basis.debug_origin_name = "HighsLpRelaxation::removeCuts";
    lpsolver.setBasis(basis);
    mipsolver.analysis_.mipTimerStart(kMipClockSimplexBasisSolveLp);
    lpsolver.run();
    mipsolver.analysis_.mipTimerStop(kMipClockSimplexBasisSolveLp);
  }
}